

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.h
# Opt level: O2

void __thiscall TreeModel::TreeModel(TreeModel *this,QObject *parent)

{
  TreeItem *this_00;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  
  QAbstractItemModel::QAbstractItemModel(&this->super_QAbstractItemModel,parent);
  *(undefined ***)this = &PTR_metaObject_00280658;
  this->markingEnabledFlag = true;
  this->markingDarkModeFlag = false;
  this_00 = (TreeItem *)operator_new(0xf0);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.size = 0;
  local_98.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char *)0x0;
  local_b8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char *)0x0;
  local_d8.size = 0;
  TreeItem::TreeItem(this_00,0,'<','\0',(QString *)&local_38,(QString *)&local_58,
                     (QString *)&local_78,(QByteArray *)&local_98,(QByteArray *)&local_b8,
                     (QByteArray *)&local_d8,true,false,(TreeItem *)0x0);
  this->rootItem = this_00;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return;
}

Assistant:

TreeModel(QObject *parent = 0) : QAbstractItemModel(parent), markingEnabledFlag(true), markingDarkModeFlag(false) {
        rootItem = new TreeItem(0, Types::Root, 0, UString(), UString(), UString(), UByteArray(), UByteArray(), UByteArray(), true, false);
    }